

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

void array_indirect_sort(int *a,int *b,int n)

{
  int iVar1;
  int local_28;
  int k;
  int j;
  int i;
  int h;
  int n_local;
  int *b_local;
  int *a_local;
  
  j = 1;
  do {
    j = j * 3 + 1;
  } while (j < n / 3);
  do {
    for (k = j; k < n; k = k + 1) {
      iVar1 = a[k];
      local_28 = k;
      do {
        if (b[a[local_28 - j]] <= b[iVar1]) break;
        a[local_28] = a[local_28 - j];
        local_28 = local_28 - j;
      } while (j <= local_28);
      a[local_28] = iVar1;
    }
    j = j / 3;
    if (j < 1) {
      return;
    }
  } while( true );
}

Assistant:

static void
array_indirect_sort(int *a, const int *b, int n)
{
    int h, i, j, k;

    /* Shell sort, as implemented in nauty, (C) Brendan McKay */
    j = n / 3;
    h = 1;
    do { h = 3 * h + 1; } while (h < j);

    do {
        for (i = h; i < n; ++i) {
            k = a[i];
            for (j = i; b[a[j-h]] > b[k]; ) {
                a[j] = a[j-h];
                if ((j -= h) < h) break;
            }
            a[j] = k;
        }
        h /= 3;
    } while (h > 0);
}